

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O0

ScriptFunctionType * Js::ScriptFunctionType::New(FunctionProxy *proxy,bool isShared)

{
  bool bVar1;
  bool isAnonymousFunction;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  DynamicTypeHandler *typeHandler_00;
  ScriptFunctionType *pSVar2;
  undefined8 local_40;
  DynamicTypeHandler *typeHandler;
  DynamicObject *functionPrototype;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  bool isShared_local;
  FunctionProxy *proxy_local;
  
  this = FunctionProxy::GetScriptContext(proxy);
  this_00 = ScriptContext::GetLibrary(this);
  bVar1 = FunctionProxy::IsAsync(proxy);
  if (bVar1) {
    local_40 = JavascriptLibraryBase::GetAsyncFunctionPrototype
                         (&this_00->super_JavascriptLibraryBase);
  }
  else {
    local_40 = JavascriptLibraryBase::GetFunctionPrototype(&this_00->super_JavascriptLibraryBase);
  }
  bVar1 = FunctionProxy::IsConstructor(proxy);
  isAnonymousFunction = FunctionProxy::GetIsAnonymousFunction(proxy);
  typeHandler_00 =
       JavascriptLibrary::ScriptFunctionTypeHandler
                 (this_00,(bool)((bVar1 ^ 0xffU) & 1),isAnonymousFunction);
  pSVar2 = New(proxy,typeHandler_00,&local_40->super_RecyclableObject,isShared);
  return pSVar2;
}

Assistant:

ScriptFunctionType * ScriptFunctionType::New(FunctionProxy * proxy, bool isShared)
    {
        ScriptContext * scriptContext = proxy->GetScriptContext();
        JavascriptLibrary * library = scriptContext->GetLibrary();
        DynamicObject * functionPrototype = proxy->IsAsync() ? library->GetAsyncFunctionPrototype() : library->GetFunctionPrototype();
        DynamicTypeHandler * typeHandler = library->ScriptFunctionTypeHandler(!proxy->IsConstructor(), proxy->GetIsAnonymousFunction());

        return New(proxy, typeHandler, functionPrototype, isShared);
    }